

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

void __thiscall
despot::SemiChainBelief::SemiChainBelief
          (SemiChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions)

{
  ulong uVar1;
  ulong uVar2;
  allocator_type local_59;
  SemiChainBelief *local_58;
  value_type local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__SemiChainBelief_00110a98;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_58 = this;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->alpha_,(long)num_mdp_actions);
  uVar1 = 0;
  uVar2 = (ulong)(uint)num_mdp_actions;
  if (num_mdp_actions < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x18 - uVar1 != 0; uVar1 = uVar1 + 0x18) {
    local_50 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,2,&local_50,&local_59);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this->alpha_).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + uVar1),&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

SemiChainBelief::SemiChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_actions);
	for (int a = 0; a < num_mdp_actions; a++) {
		alpha_[a] = vector<double>(2, 1.0);
	}
}